

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

Aig_Man_t * Fra_FraigInductionPart(Aig_Man_t *pAig,Fra_Ssw_t *pPars)

{
  int nPartSize_00;
  int fVerbose_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  abctime aVar9;
  Vec_Int_t *Entry;
  Vec_Ptr_t *pVVar10;
  abctime aVar11;
  abctime clk;
  int fVerbose;
  int nPartSize;
  int nClasses;
  int nCountRegs;
  int nCountPis;
  int i;
  int *pMapBack;
  Vec_Int_t *vPart;
  Vec_Ptr_t *vResult;
  Aig_Man_t *pNew;
  Aig_Man_t *pTemp;
  char Buffer [100];
  int fPrintParts;
  Fra_Ssw_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  aVar9 = Abc_Clock();
  nPartSize_00 = pPars->nPartSize;
  pPars->nPartSize = 0;
  fVerbose_00 = pPars->fVerbose;
  pPars->fVerbose = 0;
  if (pAig->vClockDoms == (Vec_Vec_t *)0x0) {
    vPart = (Vec_Int_t *)Aig_ManRegPartitionSimple(pAig,nPartSize_00,pPars->nOverSize);
  }
  else {
    vPart = (Vec_Int_t *)Vec_PtrAlloc(100);
    for (nCountRegs = 0; iVar4 = nCountRegs, iVar3 = Vec_PtrSize((Vec_Ptr_t *)pAig->vClockDoms),
        iVar4 < iVar3; nCountRegs = nCountRegs + 1) {
      pMapBack = (int *)Vec_PtrEntry((Vec_Ptr_t *)pAig->vClockDoms,nCountRegs);
      if ((nPartSize_00 == 0) || (iVar4 = Vec_IntSize((Vec_Int_t *)pMapBack), iVar4 <= nPartSize_00)
         ) {
        p = vPart;
        Entry = Vec_IntDup((Vec_Int_t *)pMapBack);
        Vec_PtrPush((Vec_Ptr_t *)p,Entry);
      }
      else {
        Aig_ManPartDivide((Vec_Ptr_t *)vPart,(Vec_Int_t *)pMapBack,nPartSize_00,pPars->nOverSize);
      }
    }
  }
  iVar4 = Aig_ManObjNumMax(pAig);
  Aig_ManReprStart(pAig,iVar4);
  for (nCountRegs = 0; iVar4 = nCountRegs, iVar3 = Vec_PtrSize((Vec_Ptr_t *)vPart), iVar4 < iVar3;
      nCountRegs = nCountRegs + 1) {
    pMapBack = (int *)Vec_PtrEntry((Vec_Ptr_t *)vPart,nCountRegs);
    pNew = Aig_ManRegCreatePart(pAig,(Vec_Int_t *)pMapBack,&nClasses,&nPartSize,(int **)&nCountPis);
    if (pAig->vOnehots != (Vec_Ptr_t *)0x0) {
      pVVar10 = Aig_ManRegProjectOnehots(pAig,pNew,pAig->vOnehots,fVerbose_00);
      pNew->vOnehots = pVVar10;
    }
    vResult = (Vec_Ptr_t *)Fra_FraigInduction(pNew,pPars);
    iVar3 = Aig_TransferMappedClasses(pAig,pNew,_nCountPis);
    iVar4 = nCountRegs;
    if (fVerbose_00 != 0) {
      uVar5 = Vec_IntSize((Vec_Int_t *)pMapBack);
      iVar6 = Aig_ManCiNum(pNew);
      iVar7 = Vec_IntSize((Vec_Int_t *)pMapBack);
      iVar2 = nClasses;
      iVar1 = nPartSize;
      iVar8 = Aig_ManNodeNum(pNew);
      printf("%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n"
             ,(ulong)(uint)iVar4,(ulong)uVar5,(ulong)(uint)(iVar6 - iVar7),(ulong)(uint)iVar2,
             (ulong)(uint)iVar1,iVar8,pPars->nIters,iVar3);
    }
    Aig_ManStop((Aig_Man_t *)vResult);
    Aig_ManStop(pNew);
    if (_nCountPis != (int *)0x0) {
      free(_nCountPis);
      _nCountPis = (int *)0x0;
    }
  }
  vResult = (Vec_Ptr_t *)Aig_ManDupRepr(pAig,0);
  Aig_ManSeqCleanup((Aig_Man_t *)vResult);
  Vec_VecFree((Vec_Vec_t *)vPart);
  pPars->nPartSize = nPartSize_00;
  pPars->fVerbose = fVerbose_00;
  if (fVerbose_00 != 0) {
    Abc_Print(1,"%s =","Total time");
    aVar11 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar11 - aVar9) * 1.0) / 1000000.0);
  }
  return (Aig_Man_t *)vResult;
}

Assistant:

Aig_Man_t * Fra_FraigInductionPart( Aig_Man_t * pAig, Fra_Ssw_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Aig_Man_t * pTemp, * pNew;
    Vec_Ptr_t * vResult;
    Vec_Int_t * vPart;
    int * pMapBack;
    int i, nCountPis, nCountRegs;
    int nClasses, nPartSize, fVerbose;
    abctime clk = Abc_Clock();

    // save parameters
    nPartSize = pPars->nPartSize; pPars->nPartSize = 0;
    fVerbose  = pPars->fVerbose;  pPars->fVerbose = 0;
    // generate partitions
    if ( pAig->vClockDoms )
    {
        // divide large clock domains into separate partitions
        vResult = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Vec_Int_t *, (Vec_Ptr_t *)pAig->vClockDoms, vPart, i )
        {
            if ( nPartSize && Vec_IntSize(vPart) > nPartSize )
                Aig_ManPartDivide( vResult, vPart, nPartSize, pPars->nOverSize );
            else
                Vec_PtrPush( vResult, Vec_IntDup(vPart) );
        }
    }
    else
        vResult = Aig_ManRegPartitionSimple( pAig, nPartSize, pPars->nOverSize );
//    vResult = Aig_ManPartitionSmartRegisters( pAig, nPartSize, 0 ); 
//    vResult = Aig_ManRegPartitionSmart( pAig, nPartSize );
    if ( fPrintParts )
    {
        // print partitions
        printf( "Simple partitioning. %d partitions are saved:\n", Vec_PtrSize(vResult) );
        Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
        {
            sprintf( Buffer, "part%03d.aig", i );
            pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, NULL );
            Ioa_WriteAiger( pTemp, Buffer, 0, 0 );
            printf( "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp) );
            Aig_ManStop( pTemp );
        }
    }

    // perform SSW with partitions
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vResult, vPart, i )
    {
        pTemp = Aig_ManRegCreatePart( pAig, vPart, &nCountPis, &nCountRegs, &pMapBack );
        // create the projection of 1-hot registers
        if ( pAig->vOnehots )
            pTemp->vOnehots = Aig_ManRegProjectOnehots( pAig, pTemp, pAig->vOnehots, fVerbose );
        // run SSW
        pNew = Fra_FraigInduction( pTemp, pPars );
        nClasses = Aig_TransferMappedClasses( pAig, pTemp, pMapBack );
        if ( fVerbose )
            printf( "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. It = %3d. Cl = %5d.\n", 
                i, Vec_IntSize(vPart), Aig_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Aig_ManNodeNum(pTemp), pPars->nIters, nClasses );
        Aig_ManStop( pNew );
        Aig_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }
    // remap the AIG
    pNew = Aig_ManDupRepr( pAig, 0 );
    Aig_ManSeqCleanup( pNew );
//    Aig_ManPrintStats( pAig );
//    Aig_ManPrintStats( pNew );
    Vec_VecFree( (Vec_Vec_t *)vResult );
    pPars->nPartSize = nPartSize;
    pPars->fVerbose = fVerbose;
    if ( fVerbose )
    {
        ABC_PRT( "Total time", Abc_Clock() - clk );
    }
    return pNew;
}